

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCnf.c
# Opt level: O2

int Sfm_TruthToCnf(word Truth,int nVars,Vec_Int_t *vCover,Vec_Str_t *vCnf)

{
  uint __line;
  int iVar1;
  int iVar2;
  long lVar3;
  char *__assertion;
  int Var;
  byte bVar4;
  long lVar5;
  int local_54;
  word Truth_local;
  Vec_Int_t *local_48;
  long local_40;
  long local_38;
  
  vCnf->nSize = 0;
  Truth_local = Truth;
  if (Truth + 1 < 2) {
    Vec_StrPush(vCnf,Truth == 0);
    Vec_StrPush(vCnf,-1);
    local_54 = 1;
  }
  else {
    if (nVars < 1) {
      __assertion = "nVars > 0";
      __line = 0x54;
LAB_003ff55b:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmCnf.c"
                    ,__line,"int Sfm_TruthToCnf(word, int, Vec_Int_t *, Vec_Str_t *)");
    }
    local_54 = 0;
    local_48 = vCover;
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      Truth_local = Truth_local ^ -lVar5;
      iVar1 = Kit_TruthIsop((uint *)&Truth_local,nVars,vCover,0);
      if (iVar1 != 0) {
        __assertion = "RetValue == 0";
        __line = 0x59;
        goto LAB_003ff55b;
      }
      iVar1 = vCover->nSize;
      local_54 = local_54 + iVar1;
      lVar3 = 0;
      local_40 = lVar5;
      while (lVar3 < iVar1) {
        iVar1 = vCover->pArray[lVar3];
        bVar4 = 0;
        local_38 = lVar3;
        for (Var = 0; lVar5 = local_40, nVars != Var; Var = Var + 1) {
          switch(iVar1 >> (bVar4 & 0x1f) & 3) {
          case 0:
            goto switchD_003ff4c9_caseD_0;
          case 1:
            iVar2 = 0;
            break;
          case 2:
            iVar2 = 1;
            break;
          case 3:
            __assertion = "0";
            __line = 0x65;
            goto LAB_003ff55b;
          }
          iVar2 = Abc_Var2Lit(Var,iVar2);
          Vec_StrPush(vCnf,(char)iVar2);
switchD_003ff4c9_caseD_0:
          bVar4 = bVar4 + 2;
        }
        iVar1 = Abc_Var2Lit(nVars,(int)local_40);
        Vec_StrPush(vCnf,(char)iVar1);
        Vec_StrPush(vCnf,-1);
        iVar1 = local_48->nSize;
        vCover = local_48;
        lVar3 = local_38 + 1;
      }
    }
  }
  return local_54;
}

Assistant:

int Sfm_TruthToCnf( word Truth, int nVars, Vec_Int_t * vCover, Vec_Str_t * vCnf )
{
    Vec_StrClear( vCnf );
    if ( Truth == 0 || ~Truth == 0 )
    {
//        assert( nVars == 0 );
        Vec_StrPush( vCnf, (char)(Truth == 0) );
        Vec_StrPush( vCnf, (char)-1 );
        return 1;
    }
    else 
    {
        int i, k, c, RetValue, Literal, Cube, nCubes = 0;
        assert( nVars > 0 );
        for ( c = 0; c < 2; c ++ )
        {
            Truth = c ? ~Truth : Truth;
            RetValue = Kit_TruthIsop( (unsigned *)&Truth, nVars, vCover, 0 );
            assert( RetValue == 0 );
            nCubes += Vec_IntSize( vCover );
            Vec_IntForEachEntry( vCover, Cube, i )
            {
                for ( k = 0; k < nVars; k++ )
                {
                    Literal = 3 & (Cube >> (k << 1));
                    if ( Literal == 1 )      // '0'  -> pos lit
                        Vec_StrPush( vCnf, (char)Abc_Var2Lit(k, 0) );
                    else if ( Literal == 2 ) // '1'  -> neg lit
                        Vec_StrPush( vCnf, (char)Abc_Var2Lit(k, 1) );
                    else if ( Literal != 0 )
                        assert( 0 );
                }
                Vec_StrPush( vCnf, (char)Abc_Var2Lit(nVars, c) );
                Vec_StrPush( vCnf, (char)-1 );
            }
        }
        return nCubes;
    }
}